

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

void wallet::PreventOutdatedOptions(UniValue *options)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  char *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  UniValue *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  int code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_1b2 [2];
  undefined1 local_1b0 [4];
  allocator<char> local_1ac [2];
  allocator<char> local_1aa;
  allocator<char> local_1a9 [417];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  bVar1 = UniValue::exists(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::__cxx11::string::~string(in_stack_fffffffffffffd38);
  std::allocator<char>::~allocator(local_1a9);
  if (bVar1) {
    uVar4 = __cxa_allocate_exception(0x58);
    std::operator+((char *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    code = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd48);
    JSONRPCError(code,(string *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    bVar1 = UniValue::exists(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    std::__cxx11::string::~string(in_stack_fffffffffffffd38);
    std::allocator<char>::~allocator(&local_1aa);
    if (bVar1) {
      uVar4 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
      JSONRPCError((int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                   (string *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
      bVar1 = UniValue::exists(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      std::__cxx11::string::~string(in_stack_fffffffffffffd38);
      std::allocator<char>::~allocator(local_1ac);
      if (bVar1) {
        uVar4 = __cxa_allocate_exception(0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78))
        ;
        JSONRPCError((int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                     (string *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78))
        ;
        bVar1 = UniValue::exists(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        std::__cxx11::string::~string(in_stack_fffffffffffffd38);
        std::allocator<char>::~allocator((allocator<char> *)(local_1b0 + 2));
        if (bVar1) {
          uVar4 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
          JSONRPCError((int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                       (string *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
          }
        }
        else {
          this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this,in_RDI,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
          bVar2 = UniValue::exists(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          std::__cxx11::string::~string(in_stack_fffffffffffffd38);
          std::allocator<char>::~allocator((allocator<char> *)local_1b0);
          if ((bVar2 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this,in_RDI,(allocator<char> *)CONCAT17(bVar2,in_stack_fffffffffffffd78));
            bVar3 = UniValue::exists(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
            std::__cxx11::string::~string(in_stack_fffffffffffffd38);
            std::allocator<char>::~allocator(local_1b2);
            if ((bVar3 & 1) == 0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                return;
              }
            }
            else {
              uVar4 = __cxa_allocate_exception(0x58);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (this,in_RDI,(allocator<char> *)CONCAT17(bVar2,in_stack_fffffffffffffd78));
              JSONRPCError((int)((ulong)this >> 0x20),
                           (string *)CONCAT17(bVar2,in_stack_fffffffffffffd78));
              if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
              }
            }
          }
          else {
            uVar4 = __cxa_allocate_exception(0x58);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (this,in_RDI,(allocator<char> *)CONCAT17(bVar2,in_stack_fffffffffffffd78));
            JSONRPCError((int)((ulong)this >> 0x20),
                         (string *)CONCAT17(bVar2,in_stack_fffffffffffffd78));
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(uVar4,&UniValue::typeinfo,UniValue::~UniValue);
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

static void PreventOutdatedOptions(const UniValue& options)
{
    if (options.exists("feeRate")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use fee_rate (" + CURRENCY_ATOM + "/vB) instead of feeRate");
    }
    if (options.exists("changeAddress")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use change_address instead of changeAddress");
    }
    if (options.exists("changePosition")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use change_position instead of changePosition");
    }
    if (options.exists("includeWatching")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use include_watching instead of includeWatching");
    }
    if (options.exists("lockUnspents")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use lock_unspents instead of lockUnspents");
    }
    if (options.exists("subtractFeeFromOutputs")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use subtract_fee_from_outputs instead of subtractFeeFromOutputs");
    }
}